

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::emitGlobalType(PrintSExpression *this,Global *curr)

{
  ostream *poVar1;
  char local_19;
  
  if (curr->mutable_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"(mut ",5);
    poVar1 = printType(this,(Type)(curr->type).id);
    local_19 = ')';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
    return;
  }
  printType(this,(Type)(curr->type).id);
  return;
}

Assistant:

void PrintSExpression::emitGlobalType(Global* curr) {
  if (curr->mutable_) {
    o << "(mut ";
    printType(curr->type) << ')';
  } else {
    printType(curr->type);
  }
}